

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O2

void __thiscall
t_markdown_generator::print_fn_args_doc(t_markdown_generator *this,t_function *tfunction)

{
  ofstream_with_content_based_conditional_update *poVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  pointer pptVar3;
  int iVar4;
  vector<t_field_*,_std::allocator<t_field_*>_> excepts;
  vector<t_field_*,_std::allocator<t_field_*>_> args;
  string local_50;
  
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector(&args,&tfunction->arglist_->members_);
  pptVar3 = args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
LAB_001f2fda:
    if (pptVar3 !=
        args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((((*pptVar3)->super_t_doc).has_doc_ != true) ||
         (((*pptVar3)->super_t_doc).doc_._M_string_length == 0)) goto LAB_001f2fef;
      poVar1 = &this->f_out_;
      poVar2 = std::operator<<((ostream *)poVar1,'\n');
      poVar2 = std::operator<<(poVar2,"* parameters:");
      std::operator<<(poVar2,'\n');
      iVar4 = 1;
      for (; args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start !=
             args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
          args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_start + 1) {
        poVar2 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        poVar2 = std::operator<<(poVar2,". ");
        std::operator<<(poVar2,(string *)
                               &(*args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->name_);
        poVar2 = std::operator<<((ostream *)poVar1," - ");
        escape_html(&local_50,this,
                    &((*args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                        super__Vector_impl_data._M_start)->super_t_doc).doc_);
        std::operator<<(poVar2,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::operator<<((ostream *)poVar1,'\n');
        iVar4 = iVar4 + 1;
      }
    }
  }
  std::operator<<((ostream *)&this->f_out_,'\n');
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            (&excepts,&tfunction->xceptions_->members_);
  pptVar3 = excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    for (; pptVar3 !=
           excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
           super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
      if ((((*pptVar3)->super_t_doc).has_doc_ == true) &&
         (((*pptVar3)->super_t_doc).doc_._M_string_length != 0)) {
        poVar1 = &this->f_out_;
        poVar2 = std::operator<<((ostream *)poVar1,"* exceptions:");
        std::operator<<(poVar2,'\n');
        for (; excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_start !=
               excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
            excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
          poVar2 = std::operator<<((ostream *)poVar1,"  * ");
          iVar4 = (*((*excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                       super__Vector_impl_data._M_start)->type_->super_t_doc)._vptr_t_doc[3])();
          std::operator<<(poVar2,(string *)CONCAT44(extraout_var,iVar4));
          std::operator<<((ostream *)poVar1," - ");
          escape_html(&local_50,this,
                      &((*excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                          super__Vector_impl_data._M_start)->super_t_doc).doc_);
          std::operator<<((ostream *)poVar1,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::operator<<((ostream *)poVar1,'\n');
        }
        std::operator<<((ostream *)poVar1,'\n');
        break;
      }
    }
  }
  std::_Vector_base<t_field_*,_std::allocator<t_field_*>_>::~_Vector_base
            (&excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>);
  std::_Vector_base<t_field_*,_std::allocator<t_field_*>_>::~_Vector_base
            (&args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>);
  return;
LAB_001f2fef:
  pptVar3 = pptVar3 + 1;
  goto LAB_001f2fda;
}

Assistant:

void t_markdown_generator::print_fn_args_doc(t_function* tfunction) {
  bool has_docs = false;
  vector<t_field*> args = tfunction->get_arglist()->get_members();
  vector<t_field*>::iterator arg_iter = args.begin();
  if (arg_iter != args.end()) {
    for (; arg_iter != args.end(); arg_iter++) {
      if ((*arg_iter)->has_doc() && !(*arg_iter)->get_doc().empty()) {
        has_docs = true;
        break;
      }
    }
    if (has_docs) {
      arg_iter = args.begin();
      f_out_ << endl << "* parameters:" << endl;
      for (int n = 1; arg_iter != args.end(); ++arg_iter, ++n ) {
        f_out_ << n << ". " << (*arg_iter)->get_name();
        f_out_ << " - " << escape_html((*arg_iter)->get_doc());
        f_out_ << endl;
      }
      f_out_ << endl;
    }
  }
  if(!has_docs) 
    f_out_ << endl;

  has_docs = false;
  vector<t_field*> excepts = tfunction->get_xceptions()->get_members();
  vector<t_field*>::iterator ex_iter = excepts.begin();
  if (ex_iter != excepts.end()) {
    for (; ex_iter != excepts.end(); ++ex_iter) {
      if ((*ex_iter)->has_doc() && !(*ex_iter)->get_doc().empty()) {
        has_docs = true;
        break;
      }
    }
    if (has_docs) {
      ex_iter = excepts.begin();
      f_out_ << "* exceptions:" << endl;
      for (; ex_iter != excepts.end(); ex_iter++) {
        f_out_ << "  * " << (*ex_iter)->get_type()->get_name();
        f_out_ << " - ";
        f_out_ << escape_html((*ex_iter)->get_doc());
        f_out_ << endl;
      }
      f_out_ << endl;
    }
  }
}